

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# milo.c
# Opt level: O3

void milo_free(milo_value *v)

{
  milo_type mVar1;
  long lVar2;
  ulong uVar3;
  
  if (v == (milo_value *)0x0) {
    __assert_fail("v!= NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/milo.c",
                  0x1cc,"void milo_free(milo_value *)");
  }
  mVar1 = v->type;
  if (mVar1 != MILO_STRING) {
    if (mVar1 == MILO_ARRAY) {
      if ((v->u).o.size != 0) {
        lVar2 = 0;
        uVar3 = 0;
        do {
          milo_free((milo_value *)((long)&((v->u).o.m)->k + lVar2));
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + 0x18;
        } while (uVar3 < (v->u).o.size);
      }
    }
    else {
      if (mVar1 != MILO_OBJECT) goto LAB_0010ce1f;
      if ((v->u).o.size != 0) {
        lVar2 = 0x10;
        uVar3 = 0;
        do {
          free(*(void **)((long)(v->u).o.m + lVar2 + -0x10));
          milo_free((milo_value *)((long)&((v->u).o.m)->k + lVar2));
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + 0x28;
        } while (uVar3 < (v->u).o.size);
      }
    }
  }
  free((v->u).o.m);
LAB_0010ce1f:
  v->type = MILO_NULL;
  return;
}

Assistant:

void milo_free(milo_value* v) {
    size_t  i;
    assert( v!= NULL);
    switch (v->type) {
        case MILO_STRING:
            free(v->u.s.s);
            break;
        case MILO_ARRAY:
            for (i = 0; i < v->u.a.size; i++)
                milo_free(&v->u.a.e[i]);
            free(v->u.a.e);
            break;
        case MILO_OBJECT:
            for (i = 0; i < v->u.o.size; i++) {
                free(v->u.o.m[i].k);
                milo_free(&v->u.o.m[i].v);
            }
            free(v->u.o.m);
            break;
        default: break;
    }
    v->type = MILO_NULL;
}